

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msd_dyn_vector.cpp
# Opt level: O1

void msd_D<vector_realloc_counter_clear<unsigned_char*,16u>,unsigned_short>
               (uchar **strings,size_t n,size_t depth,
               vector_realloc_counter_clear<unsigned_char_*,_16U> *buckets)

{
  ushort uVar1;
  uchar *puVar2;
  uchar *puVar3;
  int iVar4;
  uint j;
  long lVar5;
  size_t *psVar6;
  uchar **ppuVar7;
  ulong uVar8;
  byte bVar9;
  byte bVar10;
  uint j_1;
  ulong n_00;
  uint i;
  uchar **ppuVar11;
  long lVar12;
  array<unsigned_short,_256UL> bucketsize;
  ushort local_238 [260];
  
  if (n < 0x20) {
    if (1 < (long)n) {
      ppuVar7 = strings;
      do {
        iVar4 = (int)n;
        n = (size_t)(iVar4 - 1);
        puVar2 = ppuVar7[1];
        ppuVar7 = ppuVar7 + 1;
        for (ppuVar11 = ppuVar7; strings < ppuVar11; ppuVar11 = ppuVar11 + -1) {
          puVar3 = ppuVar11[-1];
          bVar9 = puVar3[depth];
          bVar10 = puVar2[depth];
          if ((bVar9 != 0) && (lVar5 = depth + 1, bVar9 == bVar10)) {
            do {
              bVar9 = puVar3[lVar5];
              bVar10 = puVar2[lVar5];
              if (bVar9 == 0) break;
              lVar5 = lVar5 + 1;
            } while (bVar9 == bVar10);
          }
          if (bVar9 <= bVar10) break;
          *ppuVar11 = puVar3;
        }
        *ppuVar11 = puVar2;
      } while (2 < iVar4);
    }
  }
  else {
    if ((n & 0xffffffffffffffe0) == 0) {
      uVar8 = 0;
    }
    else {
      uVar8 = 0;
      ppuVar7 = strings;
      do {
        lVar5 = 0;
        do {
          *(uchar *)((long)local_238 + lVar5) = ppuVar7[lVar5][depth];
          lVar5 = lVar5 + 1;
        } while (lVar5 != 0x20);
        lVar5 = 0;
        ppuVar11 = ppuVar7;
        do {
          vector_realloc_counter_clear<unsigned_char_*,_16U>::push_back
                    (buckets + *(byte *)((long)local_238 + lVar5),ppuVar11);
          lVar5 = lVar5 + 1;
          ppuVar11 = ppuVar11 + 1;
        } while (lVar5 != 0x20);
        uVar8 = uVar8 + 0x20;
        ppuVar7 = ppuVar7 + 0x20;
      } while (uVar8 < (n & 0xffffffffffffffe0));
    }
    lVar5 = n - uVar8;
    if (uVar8 <= n && lVar5 != 0) {
      ppuVar7 = strings + uVar8;
      do {
        vector_realloc_counter_clear<unsigned_char_*,_16U>::push_back
                  (buckets + (*ppuVar7)[depth],ppuVar7);
        ppuVar7 = ppuVar7 + 1;
        lVar5 = lVar5 + -1;
      } while (lVar5 != 0);
    }
    psVar6 = &buckets->_size;
    lVar5 = 0;
    do {
      local_238[lVar5] = (ushort)*psVar6;
      lVar5 = lVar5 + 1;
      psVar6 = psVar6 + 3;
    } while (lVar5 != 0x100);
    psVar6 = &buckets->_size;
    lVar5 = 0;
    lVar12 = 0;
    do {
      uVar1 = local_238[lVar5];
      if ((ulong)uVar1 != 0) {
        if (*psVar6 != 0) {
          memmove(strings + lVar12,
                  ((vector_realloc_counter_clear<unsigned_char_*,_16U> *)(psVar6 + -1))->_data,
                  *psVar6 << 3);
        }
        lVar12 = lVar12 + (ulong)uVar1;
      }
      lVar5 = lVar5 + 1;
      psVar6 = psVar6 + 3;
    } while (lVar5 != 0x100);
    lVar5 = 8;
    do {
      *(undefined8 *)((long)&buckets->_data + lVar5) = 0;
      lVar5 = lVar5 + 0x18;
    } while (lVar5 != 0x1808);
    uVar8 = (ulong)local_238[0];
    lVar5 = 1;
    do {
      n_00 = (ulong)local_238[lVar5];
      if (n_00 != 0) {
        msd_D<vector_realloc_counter_clear<unsigned_char*,16u>,unsigned_short>
                  (strings + uVar8,n_00,depth + 1,buckets);
        uVar8 = uVar8 + n_00;
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 != 0x100);
  }
  return;
}

Assistant:

static void
msd_D(unsigned char** strings, size_t n, size_t depth, Bucket* buckets)
{
	if (n < 32) {
		insertion_sort(strings, n, depth);
		return;
	}
	// Use a small cache to reduce memory stalls.
	size_t i=0;
	for (; i < n-n%32; i+=32) {
		unsigned char cache[32];
		for (unsigned j=0; j < 32; ++j) {
			cache[j] = strings[i+j][depth];
		}
		for (unsigned j=0; j < 32; ++j) {
			buckets[cache[j]].push_back(strings[i+j]);
		}
	}
	for (; i < n; ++i) {
		buckets[strings[i][depth]].push_back(strings[i]);
	}
	std::array<BucketsizeType, 256> bucketsize;
	for (unsigned i=0; i < 256; ++i) {
		bucketsize[i] = buckets[i].size();
	}
	size_t pos = 0;
	for (unsigned i=0; i < 256; ++i) {
		if (bucketsize[i] == 0) continue;
		copy(buckets[i], strings+pos);
		pos += bucketsize[i];
	}
	for (unsigned i=0; i < 256; ++i) {
		buckets[i].clear();
	}
	pos = bucketsize[0];
	for (unsigned i=1; i < 256; ++i) {
		if (bucketsize[i] == 0) continue;
		msd_D<Bucket, BucketsizeType>(strings+pos, bucketsize[i], depth+1, buckets);
		pos += bucketsize[i];
	}
}